

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initFormFiles(VcprojGenerator *this)

{
  VCFilter *this_00;
  QMakeProject *this_01;
  ProStringList *fileList;
  long in_FS_OFFSET;
  ProKey PStack_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).FormFiles;
  QString::operator=(&this_00->Name,"Form Files");
  (this->vcProject).FormFiles.ParseFiles = _False;
  QString::operator=(&(this->vcProject).FormFiles.Filter,"ui");
  QString::operator=(&(this->vcProject).FormFiles.Guid,"{99349809-55BA-4b9d-BF79-8FDBB0286EB3}");
  this_01 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&PStack_58,"FORMS");
  fileList = QMakeEvaluator::valuesRef(&this_01->super_QMakeEvaluator,&PStack_58);
  VCFilter::addFiles(this_00,fileList);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_58);
  (this->vcProject).FormFiles.Project = this;
  (this->vcProject).FormFiles.Config = &(this->vcProject).Configuration;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initFormFiles()
{
    vcProject.FormFiles.Name = "Form Files";
    vcProject.FormFiles.ParseFiles = _False;
    vcProject.FormFiles.Filter = "ui";
    vcProject.FormFiles.Guid = _GUIDFormFiles;
    vcProject.FormFiles.addFiles(project->values("FORMS"));
    vcProject.FormFiles.Project = this;
    vcProject.FormFiles.Config = &(vcProject.Configuration);
}